

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfSystemSpecific.h
# Opt level: O0

void * Imf_2_5::EXRAllocAligned(size_t size,size_t alignment)

{
  int iVar1;
  size_t in_RSI;
  size_t in_RDI;
  void *ptr;
  void *local_18 [3];
  
  local_18[0] = (void *)0x0;
  iVar1 = posix_memalign(local_18,in_RSI,in_RDI);
  if (iVar1 != 0) {
    local_18[0] = (void *)0x0;
  }
  return local_18[0];
}

Assistant:

inline void*
EXRAllocAligned (size_t size, size_t alignment)
{
    // GNUC is used for things like mingw to (cross-)compile for windows
#ifdef _WIN32
    return _aligned_malloc (size, alignment);
#elif defined(__INTEL_COMPILER) || defined(__ICL) || defined(__ICC) || defined(__ECC)
    return _mm_malloc (size, alignment);
#elif defined(_POSIX_C_SOURCE) && (_POSIX_C_SOURCE >= 200112L)
    void* ptr = 0;
    // With fortify_source on, just doing the (void) cast trick
    // doesn't remove the unused result warning but we expect the
    // other mallocs to return null and to check the return value
    // of this function
    if ( posix_memalign (&ptr, alignment, size) )
        ptr = 0;
    return ptr;
#else
    return malloc(size);
#endif
}